

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O1

void hmac_genresult(ssh2_mac *mac,uchar *output)

{
  BinarySink *pBVar1;
  ssh2_macalg *psVar2;
  long *plVar3;
  
  pBVar1 = mac[-2].binarysink_;
  psVar2 = mac[-1].vt;
  plVar3 = (long *)(**(code **)pBVar1->write)();
  (**(code **)(*plVar3 + 0x10))(plVar3,pBVar1);
  (**(code **)(*plVar3 + 0x18))(plVar3,psVar2);
  (**(code **)(*plVar3 + 0x20))(plVar3);
  pBVar1 = mac[-3].binarysink_;
  plVar3 = (long *)(**(code **)pBVar1->write)();
  (**(code **)(*plVar3 + 0x10))(plVar3,pBVar1);
  BinarySink_put_data((BinarySink *)plVar3[1],mac[-1].vt,(size_t)(mac[-3].vt)->text_name);
  (**(code **)(*plVar3 + 0x18))(plVar3,mac[-1].vt);
  (**(code **)(*plVar3 + 0x20))(plVar3);
  memcpy(output,mac[-1].vt,(long)mac->vt->len);
  smemclr(mac[-1].vt,(size_t)(mac[-3].vt)->text_name);
  return;
}

Assistant:

static void hmac_genresult(ssh2_mac *mac, unsigned char *output)
{
    struct hmac *ctx = container_of(mac, struct hmac, mac);
    ssh_hash *htmp;

    /* Leave h_live and h_outer in place, so that the SSH-2 BPP can
     * continue regenerating test results from different-length
     * prefixes of the packet */
    ssh_hash_digest_nondestructive(ctx->h_live, ctx->digest);

    htmp = ssh_hash_copy(ctx->h_outer);
    put_data(htmp, ctx->digest, ctx->hashalg->hlen);
    ssh_hash_final(htmp, ctx->digest);

    /*
     * Some instances of HMAC truncate the output hash, so instead of
     * writing it directly to 'output' we wrote it to our own
     * full-length buffer, and now we copy the required amount.
     */
    memcpy(output, ctx->digest, mac->vt->len);
    smemclr(ctx->digest, ctx->hashalg->hlen);
}